

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O0

void __thiscall adios2::core::engine::CampaignManager::Close(CampaignManager *this)

{
  bool bVar1;
  string *in_RDI;
  string *in_stack_000003b0;
  int in_stack_000003bc;
  CampaignRecordMap *in_stack_000003c0;
  string local_28 [40];
  
  bVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
          ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>_>
                   *)0xdb4a5f);
  if (!bVar1) {
    helper::CreateDirectory(in_RDI);
    std::__cxx11::string::string(local_28,(string *)in_RDI[3].field_2._M_local_buf);
    CMapToSqlite(in_stack_000003c0,in_stack_000003bc,in_stack_000003b0);
    std::__cxx11::string::~string(local_28);
  }
  *(undefined1 *)&in_RDI[3]._M_string_length = 0;
  return;
}

Assistant:

void CampaignManager::Close()
{
    if (!cmap.empty())
    {
        helper::CreateDirectory(m_CampaignDir);
        CMapToSqlite(cmap, m_WriterRank, m_Name);
    }
    m_Opened = false;
}